

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

void Cec2_ManDestroy(Cec2_Man_t *p)

{
  abctime aVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double local_b8;
  double local_a8;
  double local_98;
  double local_88;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  double local_38;
  abctime timeOther;
  abctime timeSat;
  abctime timeTotal;
  Cec2_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    aVar1 = Abc_Clock();
    lVar2 = aVar1 - p->timeStart;
    lVar3 = p->timeSatSat + p->timeSatUnsat + p->timeSatUndec;
    lVar4 = (((lVar2 - lVar3) - p->timeSim) - p->timeRefine) - p->timeExtra;
    Abc_Print(1,"%s =","SAT solving");
    if (((double)lVar2 != 0.0) || (NAN((double)lVar2))) {
      local_38 = ((double)lVar3 * 100.0) / (double)lVar2;
    }
    else {
      local_38 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar3 * 1.0) / 1000000.0,local_38);
    Abc_Print(1,"%s =","  sat      ");
    if (((double)lVar2 != 0.0) || (NAN((double)lVar2))) {
      local_48 = ((double)p->timeSatSat * 100.0) / (double)lVar2;
    }
    else {
      local_48 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatSat * 1.0) / 1000000.0,local_48);
    Abc_Print(1,"%s =","  unsat    ");
    if (((double)lVar2 != 0.0) || (NAN((double)lVar2))) {
      local_58 = ((double)p->timeSatUnsat * 100.0) / (double)lVar2;
    }
    else {
      local_58 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatUnsat * 1.0) / 1000000.0,local_58);
    Abc_Print(1,"%s =","  fail     ");
    if (((double)lVar2 != 0.0) || (NAN((double)lVar2))) {
      local_68 = ((double)p->timeSatUndec * 100.0) / (double)lVar2;
    }
    else {
      local_68 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatUndec * 1.0) / 1000000.0,local_68);
    Abc_Print(1,"%s =","Simulation ");
    if (((double)lVar2 != 0.0) || (NAN((double)lVar2))) {
      local_78 = ((double)p->timeSim * 100.0) / (double)lVar2;
    }
    else {
      local_78 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSim * 1.0) / 1000000.0,local_78);
    Abc_Print(1,"%s =","Refinement ");
    if (((double)lVar2 != 0.0) || (NAN((double)lVar2))) {
      local_88 = ((double)p->timeRefine * 100.0) / (double)lVar2;
    }
    else {
      local_88 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeRefine * 1.0) / 1000000.0,local_88);
    Abc_Print(1,"%s =","Rollback   ");
    if (((double)lVar2 != 0.0) || (NAN((double)lVar2))) {
      local_98 = ((double)p->timeExtra * 100.0) / (double)lVar2;
    }
    else {
      local_98 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeExtra * 1.0) / 1000000.0,local_98);
    Abc_Print(1,"%s =","Other      ");
    if (((double)lVar2 != 0.0) || (NAN((double)lVar2))) {
      local_a8 = ((double)lVar4 * 100.0) / (double)lVar2;
    }
    else {
      local_a8 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar4 * 1.0) / 1000000.0,local_a8);
    Abc_Print(1,"%s =","TOTAL      ");
    if (((double)lVar2 != 0.0) || (NAN((double)lVar2))) {
      local_b8 = ((double)lVar2 * 100.0) / (double)lVar2;
    }
    else {
      local_b8 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar2 * 1.0) / 1000000.0,local_b8);
    fflush(_stdout);
  }
  Vec_WrdFreeP(&p->pAig->vSims);
  Gia_ManCleanMark01(p->pAig);
  satoko_destroy(p->pSat);
  Gia_ManStopP(&p->pNew);
  Vec_PtrFreeP(&p->vFrontier);
  Vec_PtrFreeP(&p->vFanins);
  Vec_IntFreeP(&p->vNodesNew);
  Vec_IntFreeP(&p->vSatVars);
  Vec_IntFreeP(&p->vObjSatPairs);
  Vec_IntFreeP(&p->vCexTriples);
  if (p != (Cec2_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Cec2_ManDestroy( Cec2_Man_t * p )
{
    if ( p->pPars->fVerbose ) 
    {
        abctime timeTotal = Abc_Clock() - p->timeStart;
        abctime timeSat   = p->timeSatSat + p->timeSatUnsat + p->timeSatUndec;
        abctime timeOther = timeTotal - timeSat - p->timeSim - p->timeRefine - p->timeExtra;
//        Abc_Print( 1, "%d\n", p->Num );
        ABC_PRTP( "SAT solving", timeSat,          timeTotal );
        ABC_PRTP( "  sat      ", p->timeSatSat,    timeTotal );
        ABC_PRTP( "  unsat    ", p->timeSatUnsat,  timeTotal );
        ABC_PRTP( "  fail     ", p->timeSatUndec,  timeTotal );
        ABC_PRTP( "Simulation ", p->timeSim,       timeTotal );
        ABC_PRTP( "Refinement ", p->timeRefine,    timeTotal );
        ABC_PRTP( "Rollback   ", p->timeExtra,     timeTotal );
        ABC_PRTP( "Other      ", timeOther,        timeTotal );
        ABC_PRTP( "TOTAL      ", timeTotal,        timeTotal );
        fflush( stdout );
    }

    Vec_WrdFreeP( &p->pAig->vSims );
    //Vec_WrdFreeP( &p->pAig->vSimsPi );
    Gia_ManCleanMark01( p->pAig );
    satoko_destroy( p->pSat );
    Gia_ManStopP( &p->pNew );
    Vec_PtrFreeP( &p->vFrontier );
    Vec_PtrFreeP( &p->vFanins );
    Vec_IntFreeP( &p->vNodesNew );
    Vec_IntFreeP( &p->vSatVars );
    Vec_IntFreeP( &p->vObjSatPairs );
    Vec_IntFreeP( &p->vCexTriples );
    ABC_FREE( p );
}